

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# output_local.c
# Opt level: O2

mpt_output * localPassOutput(mpt_local_output *lo)

{
  mpt_metatype *pmVar1;
  int iVar2;
  mpt_output *out;
  mpt_output *local_8;
  
  local_8 = (mpt_output *)0x0;
  pmVar1 = lo->pass;
  if ((pmVar1 == (mpt_metatype *)0x0) ||
     (iVar2 = (*(pmVar1->_vptr->convertable).convert)((mpt_convertable *)pmVar1,0x83,&local_8),
     iVar2 < 0)) {
    local_8 = (mpt_output *)0x0;
  }
  return local_8;
}

Assistant:

inline static MPT_INTERFACE(output) *localPassOutput(const MPT_STRUCT(local_output) *lo)
{
	MPT_INTERFACE(metatype) *mt;
	MPT_INTERFACE(output) *out;
	out = 0;
	if (!(mt = lo->pass)
	    || MPT_metatype_convert(mt, MPT_ENUM(TypeOutputPtr), &out) < 0) {
		return 0;
	}
	return out;
}